

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_callnoyield(lua_State *L,StkId func,int nResults)

{
  uint uVar1;
  CallInfo *ci;
  StkId local_20;
  
  uVar1 = L->nCcalls + 0x10001;
  L->nCcalls = uVar1;
  if (199 < (uVar1 & 0xfff8)) {
    luaD_callnoyield_cold_1();
    func = local_20;
  }
  ci = luaD_precall(L,func,nResults);
  if (ci != (CallInfo *)0x0) {
    ci->callstatus = 4;
    luaV_execute(L,ci);
  }
  L->nCcalls = L->nCcalls - 0x10001;
  return;
}

Assistant:

void luaD_callnoyield (lua_State *L, StkId func, int nResults) {
  ccall(L, func, nResults, nyci);
}